

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight)

{
  Expr *pRoot;
  
  if ((op == 0x2c) && (pParse->nErr == 0)) {
    pRoot = sqlite3ExprAnd(pParse->db,pLeft,pRight);
    if (pRoot == (Expr *)0x0) {
      return (Expr *)0x0;
    }
  }
  else {
    pRoot = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x50);
    if (pRoot == (Expr *)0x0) {
      sqlite3ExprAttachSubtrees(pParse->db,(Expr *)0x0,pLeft,pRight);
      return (Expr *)0x0;
    }
    pRoot->op = '\0';
    pRoot->affinity = '\0';
    *(undefined2 *)&pRoot->field_0x2 = 0;
    pRoot->flags = 0;
    (pRoot->u).zToken = (char *)0x0;
    pRoot->iColumn = 0;
    pRoot->iAgg = 0;
    pRoot->iRightJoinTable = 0;
    pRoot->op2 = '\0';
    pRoot->field_0x37 = 0;
    pRoot->pAggInfo = (AggInfo *)0x0;
    pRoot->pTab = (Table *)0x0;
    pRoot->pWin = (Window *)0x0;
    (pRoot->x).pList = (ExprList *)0x0;
    pRoot->nHeight = 0;
    pRoot->iTable = 0;
    pRoot->pLeft = (Expr *)0x0;
    pRoot->pRight = (Expr *)0x0;
    pRoot->op = (u8)op;
    pRoot->iAgg = -1;
    sqlite3ExprAttachSubtrees(pParse->db,pRoot,pLeft,pRight);
  }
  if (pParse->db->aLimit[3] < pRoot->nHeight) {
    sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
  }
  return pRoot;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight            /* Right operand */
){
  Expr *p;
  if( op==TK_AND && pParse->nErr==0 ){
    /* Take advantage of short-circuit false optimization for AND */
    p = sqlite3ExprAnd(pParse->db, pLeft, pRight);
  }else{
    p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr));
    if( p ){
      memset(p, 0, sizeof(Expr));
      p->op = op & TKFLG_MASK;
      p->iAgg = -1;
    }
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
  }
  if( p ) {
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }
  return p;
}